

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall kj::anon_unknown_8::DiskHandle::zero(DiskHandle *this,uint64_t offset,uint64_t size)

{
  int osErrorNumber;
  WiderType<Decay<const_unsigned_long_&>,_Decay<unsigned_long_&>_> size_00;
  iovec *piVar1;
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  ArrayPtr<iovec> AVar5;
  Fault local_228;
  Fault f_2;
  Fault f_1;
  SyscallResult local_1ec;
  undefined1 auStack_1e8 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  size_t rem;
  size_t iovCount;
  iovec *item;
  iovec *__end2;
  iovec *__begin2;
  ArrayPtr<iovec> *__range2;
  ArrayPtr<iovec> iov;
  Array<iovec> iov_heap;
  iovec iov_stack [16];
  bool iov_isOnStack;
  size_t iov_size;
  size_t iovmax;
  size_t count;
  Fault local_50;
  Fault f;
  undefined1 auStack_40 [4];
  int error;
  uint64_t *local_38;
  uint64_t *local_30;
  int local_24;
  uint64_t uStack_20;
  int _kjSyscallError;
  uint64_t size_local;
  uint64_t offset_local;
  DiskHandle *this_local;
  
  local_38 = &size_local;
  local_30 = &stack0xffffffffffffffe0;
  _auStack_40 = this;
  uStack_20 = size;
  size_local = offset;
  offset_local = (uint64_t)this;
  f.exception._4_4_ =
       _::Debug::
       syscallError<kj::(anonymous_namespace)::DiskHandle::zero(unsigned_long,unsigned_long)const::_lambda()_1_>
                 ((anon_class_24_3_f4ac2553 *)auStack_40,false);
  if (f.exception._4_4_ != 0) {
    local_24 = f.exception._4_4_;
    if (f.exception._4_4_ == 0x5f) {
      iovmax = uStack_20 + 0xfff >> 0xc;
      iov_size = miniposix::iovMax(iovmax);
      size_00 = min<unsigned_long_const&,unsigned_long&>(&iov_size,&iovmax);
      if (size_00 < 0x11) {
        Array<iovec>::Array((Array<iovec> *)&iov.size_,(void *)0x0);
        AVar5 = arrayPtr<iovec>((iovec *)&iov_heap.disposer,size_00);
      }
      else {
        heapArray<iovec>((Array<iovec> *)&iov.size_,size_00);
        AVar5 = kj::Array::operator_cast_to_ArrayPtr((Array *)&iov.size_);
      }
      iov.ptr = (iovec *)AVar5.size_;
      __range2 = (ArrayPtr<iovec> *)AVar5.ptr;
      __end2 = ArrayPtr<iovec>::begin((ArrayPtr<iovec> *)&__range2);
      piVar1 = ArrayPtr<iovec>::end((ArrayPtr<iovec> *)&__range2);
      for (; __end2 != piVar1; __end2 = __end2 + 1) {
        __end2->iov_base = "";
        __end2->iov_len = 0x1000;
      }
      for (; uVar3 = uStack_20, uStack_20 != 0; uStack_20 = uStack_20 - (long)_auStack_1e8) {
        sVar2 = ArrayPtr<iovec>::size((ArrayPtr<iovec> *)&__range2);
        if (uVar3 < sVar2 << 0xc) {
          uVar3 = uStack_20 & 0xfff;
          if (uVar3 != 0) {
            piVar1 = ArrayPtr<iovec>::operator[]((ArrayPtr<iovec> *)&__range2,uStack_20 >> 0xc);
            piVar1->iov_len = uVar3;
          }
        }
        else {
          ArrayPtr<iovec>::size((ArrayPtr<iovec> *)&__range2);
        }
        f_1.exception = (Exception *)auStack_1e8;
        local_1ec = _::Debug::
                    syscall<kj::(anonymous_namespace)::DiskHandle::zero(unsigned_long,unsigned_long)const::_lambda()_2_>
                              ((anon_class_40_5_3fb10c06 *)&f_1,false);
        pvVar4 = _::Debug::SyscallResult::operator_cast_to_void_(&local_1ec);
        if (pvVar4 == (void *)0x0) {
          osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_1ec);
          _::Debug::Fault::Fault
                    (&f_2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x1af,osErrorNumber,"n = pwritev(fd, iov.begin(), count, offset)","");
          _::Debug::Fault::fatal(&f_2);
        }
        if ((long)_auStack_1e8 < 1) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    (&local_228,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x1b0,FAILED,"n > 0","\"pwrite() returned zero?\"",
                     (char (*) [24])"pwrite() returned zero?");
          _::Debug::Fault::fatal(&local_228);
        }
        size_local = (uint64_t)(_auStack_1e8 + size_local);
      }
      Array<iovec>::~Array((Array<iovec> *)&iov.size_);
    }
    else {
      _::Debug::Fault::Fault
                (&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x187,f.exception._4_4_,"fallocate(FALLOC_FL_PUNCH_HOLE)","");
      _::Debug::Fault::~Fault(&local_50);
    }
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t size) const {
#ifdef FALLOC_FL_PUNCH_HOLE
    KJ_SYSCALL_HANDLE_ERRORS(
        fallocate(fd, FALLOC_FL_PUNCH_HOLE | FALLOC_FL_KEEP_SIZE, offset, size)) {
      case EOPNOTSUPP:
        // fall back to below
        break;
      default:
        KJ_FAIL_SYSCALL("fallocate(FALLOC_FL_PUNCH_HOLE)", error) { return; }
    } else {
      return;
    }
#endif

    static const byte ZEROS[4096] = { 0 };

#if __APPLE__ || __CYGWIN__ || (defined(__ANDROID__) && __ANDROID_API__ < 24)
    // Mac & Cygwin & Android API levels 23 and lower doesn't have pwritev().
    while (size > sizeof(ZEROS)) {
      write(offset, ZEROS);
      size -= sizeof(ZEROS);
      offset += sizeof(ZEROS);
    }
    write(offset, kj::arrayPtr(ZEROS, size));
#else
    // Use a 4k buffer of zeros amplified by iov to write zeros with as few syscalls as possible.
    size_t count = (size + sizeof(ZEROS) - 1) / sizeof(ZEROS);
    const size_t iovmax = miniposix::iovMax(count);
    KJ_STACK_ARRAY(struct iovec, iov, kj::min(iovmax, count), 16, 256);

    for (auto& item: iov) {
      item.iov_base = const_cast<byte*>(ZEROS);
      item.iov_len = sizeof(ZEROS);
    }

    while (size > 0) {
      size_t iovCount;
      if (size >= iov.size() * sizeof(ZEROS)) {
        iovCount = iov.size();
      } else {
        iovCount = size / sizeof(ZEROS);
        size_t rem = size % sizeof(ZEROS);
        if (rem > 0) {
          iov[iovCount++].iov_len = rem;
        }
      }

      ssize_t n;
      KJ_SYSCALL(n = pwritev(fd, iov.begin(), count, offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");

      offset += n;
      size -= n;
    }
#endif
  }